

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall AmpIO::ReadPowerStatus(AmpIO *this,uint index)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = BoardIO::ReadStatus((BoardIO *)this);
  bVar3 = (bool)((byte)(uVar1 >> 0x13) & 1);
  uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
  bVar4 = bVar3;
  if ((uVar2 == 0x44514c41) && (bVar4 = ((index & 3) << 0xe & ~uVar1) == 0, (index & 3) == 0)) {
    bVar4 = bVar3;
  }
  return bVar4;
}

Assistant:

bool AmpIO::ReadPowerStatus(unsigned int index) const
{
    uint32_t status = ReadStatus();
    bool ret = status & MV_GOOD_BIT;
    if (GetHardwareVersion() == DQLA_String) {
        uint32_t mask = 0;
        if (index&1) mask |= DQLA_MV_GOOD_1;
        if (index&2) mask |= DQLA_MV_GOOD_2;
        if (mask != 0)
            ret = ((status & mask) == mask);
    }
    return ret;

}